

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall front::symbol::VoidSymbol::VoidSymbol(VoidSymbol *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"void",&local_31);
  Symbol::Symbol(&this->super_Symbol,&local_30,-1);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001da9d0;
  return;
}

Assistant:

VoidSymbol() : Symbol("void", -1) {}